

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelFixedSamplesCase::checkTextureState
          (TextureLevelFixedSamplesCase *this,CallLogWrapper *gl,TextureGenerationSpec *spec)

{
  pointer pTVar1;
  pointer pTVar2;
  bool bVar3;
  int level;
  uint refValue;
  
  pTVar1 = (spec->levels).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (spec->levels).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar1 == pTVar2) {
    level = 0;
  }
  else {
    level = pTVar1->level;
  }
  refValue = 1;
  if (pTVar1 != pTVar2) {
    refValue = (uint)spec->fixedSamplePos;
  }
  bVar3 = verifyTextureLevelParameterEqual
                    (gl,spec->queryTarget,level,0x9107,refValue,
                     (this->super_TextureLevelCommonCase).super_TextureLevelCase.m_type);
  return bVar3;
}

Assistant:

bool checkTextureState (glu::CallLogWrapper& gl, const TextureGenerationSpec& spec)
	{
		const int queryLevel	= (spec.levels.empty()) ? (0) : (spec.levels[0].level);
		const int refValue		= (spec.levels.empty()) ? (1) : ((spec.fixedSamplePos) ? (1) : (0));

		return verifyTextureLevelParameterEqual(gl, spec.queryTarget, queryLevel, GL_TEXTURE_FIXED_SAMPLE_LOCATIONS, refValue, m_type);
	}